

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweep.c
# Opt level: O3

void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *p)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int *__ptr;
  int iVar4;
  Vec_Int_t *__ptr_00;
  long lVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  
  if (p->pManTime == (void *)0x0) {
    return;
  }
  Gia_ManCreateRefs(p);
  iVar2 = p->nRegs;
  iVar6 = p->vCos->nSize;
  iVar4 = Gia_ManRegBoxNum(p);
  uVar10 = iVar6 - (iVar4 + iVar2);
  iVar2 = p->vCos->nSize;
  iVar6 = iVar2 - p->nRegs;
  uVar7 = 0;
  if ((int)uVar10 < iVar6) {
    uVar8 = (ulong)uVar10;
    uVar7 = 0;
    do {
      if (((int)uVar10 < 0) || (iVar2 <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = p->vCos->pArray[uVar8];
      if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) goto LAB_0073147b;
      pGVar3 = p->pObjs;
      pGVar1 = pGVar3 + iVar4;
      uVar9 = (ulong)((uint)*(undefined8 *)pGVar1 & 0x1fffffff);
      if ((~*(uint *)(pGVar1 + -uVar9) & 0x9fffffff) != 0) {
        __assert_fail("Gia_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaSweep.c"
                      ,0x1ac,"void Gia_ManCheckIntegrityWithBoxes(Gia_Man_t *)");
      }
      pGVar1 = pGVar1 + -uVar9;
      if ((pGVar1 < pGVar3) || (pGVar3 + (uint)p->nObjs <= pGVar1)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar7 = uVar7 + (1 < p->pRefs[(int)((ulong)((long)pGVar1 - (long)pGVar3) >> 2) * -0x55555555])
      ;
      uVar8 = uVar8 + 1;
    } while ((int)uVar8 < iVar6);
  }
  __ptr_00 = Gia_ManComputeCarryOuts(p);
  __ptr = __ptr_00->pArray;
  if ((long)__ptr_00->nSize < 1) {
    uVar10 = 0;
    if (__ptr == (int *)0x0) goto LAB_00731438;
  }
  else {
    lVar5 = 0;
    uVar10 = 0;
    do {
      iVar2 = __ptr[lVar5];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_0073147b:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      uVar10 = uVar10 + (1 < p->pRefs[iVar2]);
      lVar5 = lVar5 + 1;
    } while (__ptr_00->nSize != lVar5);
  }
  free(__ptr);
LAB_00731438:
  free(__ptr_00);
  if (uVar7 != 0 || uVar10 != 0) {
    printf("Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n",
           (ulong)uVar7,(ulong)uVar10);
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  return;
}

Assistant:

void Gia_ManCheckIntegrityWithBoxes( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    Vec_Int_t * vCarryOuts;
    int i, nCountReg = 0, nCountCarry = 0;
    if ( p->pManTime == NULL )
        return;
    Gia_ManCreateRefs( p );
    for ( i = Gia_ManPoNum(p) - Gia_ManRegBoxNum(p); i < Gia_ManPoNum(p); i++ )
    {
        pObj = Gia_ObjFanin0( Gia_ManPo(p, i) );
        assert( Gia_ObjIsCi(pObj) );
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountReg++;
    }
    vCarryOuts = Gia_ManComputeCarryOuts( p );
    Gia_ManForEachObjVec( vCarryOuts, p, pObj, i )
        if ( Gia_ObjRefNum(p, pObj) > 1 )
            nCountCarry++;
    Vec_IntFree( vCarryOuts );
    if ( nCountReg || nCountCarry )
        printf( "Warning: AIG with boxes has internal fanout in %d complex flops and %d carries.\n", nCountReg, nCountCarry );
    ABC_FREE( p->pRefs );
}